

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O2

int quicly_sendstate_shutdown(quicly_sendstate_t *state,uint64_t final_size)

{
  size_t sVar1;
  quicly_range_t *pqVar2;
  uint __line;
  int iVar3;
  char *__assertion;
  
  if (state->final_size == 0xffffffffffffffff) {
    if (state->size_inflight <= final_size) {
      sVar1 = (state->pending).num_ranges;
      if ((sVar1 == 0) ||
         (pqVar2 = (state->pending).ranges, pqVar2[sVar1 - 1].end != 0xffffffffffffffff)) {
        iVar3 = quicly_ranges_add(&state->pending,state->size_inflight,final_size + 1);
        if (iVar3 != 0) {
          return iVar3;
        }
      }
      else {
        pqVar2[sVar1 - 1].end = final_size + 1;
      }
      state->final_size = final_size;
      return 0;
    }
    __assertion = "state->size_inflight <= final_size";
    __line = 0x48;
  }
  else {
    __assertion = "quicly_sendstate_is_open(state)";
    __line = 0x47;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                ,__line,"int quicly_sendstate_shutdown(quicly_sendstate_t *, uint64_t)");
}

Assistant:

int quicly_sendstate_shutdown(quicly_sendstate_t *state, uint64_t final_size)
{
    int ret;

    assert(quicly_sendstate_is_open(state));
    assert(state->size_inflight <= final_size);

    if (state->pending.num_ranges != 0 && state->pending.ranges[state->pending.num_ranges - 1].end == UINT64_MAX) {
        state->pending.ranges[state->pending.num_ranges - 1].end = final_size + 1;
    } else {
        if ((ret = quicly_ranges_add(&state->pending, state->size_inflight, final_size + 1)) != 0)
            return ret;
    }

    state->final_size = final_size;
    return 0;
}